

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bar.c
# Opt level: O0

void Bar_ProgressShow(Bar_Progress_t *p,char *pString)

{
  int iVar1;
  size_t sVar2;
  int local_28;
  int local_1c;
  int i;
  char *pString_local;
  Bar_Progress_t *p_local;
  
  if ((p != (Bar_Progress_t *)0x0) && (iVar1 = Abc_FrameIsBatchMode(), iVar1 == 0)) {
    if (pString == (char *)0x0) {
      local_28 = 0;
    }
    else {
      fprintf((FILE *)p->pFile,"%s ",pString);
      sVar2 = strlen(pString);
      local_28 = (int)sVar2 + 1;
    }
    for (local_1c = local_28; local_1c < p->posCur; local_1c = local_1c + 1) {
      fprintf((FILE *)p->pFile,"-");
    }
    if (local_1c == p->posCur) {
      fprintf((FILE *)p->pFile,">");
    }
    while (local_1c = local_1c + 1, local_1c <= p->posTotal) {
      fprintf((FILE *)p->pFile," ");
    }
    fprintf((FILE *)p->pFile,"\r");
    fflush(_stdout);
  }
  return;
}

Assistant:

void Bar_ProgressShow( Bar_Progress_t * p, char * pString )
{
    int i;
    if ( p == NULL ) 
        return;
    if ( Abc_FrameIsBatchMode() )
        return;
    if ( pString )
        fprintf( p->pFile, "%s ", pString );
    for ( i = (pString? strlen(pString) + 1 : 0); i < p->posCur; i++ )
        fprintf( p->pFile, "-" );
    if ( i == p->posCur )
        fprintf( p->pFile, ">" );
    for ( i++  ; i <= p->posTotal; i++ )
        fprintf( p->pFile, " " );
    fprintf( p->pFile, "\r" );
    fflush( stdout );
}